

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O2

int32 make_CD_heap(hashelement_t **triphonehash,int32 threshold,heapelement_t ***CDheap,
                  int32 *cdheapsize)

{
  hashelement_t *phVar1;
  int32 heapsize;
  heapelement_t *newelement;
  char *pcVar2;
  hashelement_t **pphVar3;
  heapelement_t **heap;
  heapelement_t ***local_50;
  int32 *local_48;
  hashelement_t **local_40;
  long local_38;
  
  heap = (heapelement_t **)0x0;
  local_38 = 0;
  heapsize = 0;
  local_50 = CDheap;
  local_48 = cdheapsize;
  local_40 = triphonehash;
  do {
    if (local_38 == 0x5dc1) {
      *local_50 = heap;
      *local_48 = heapsize;
      return 0;
    }
    pphVar3 = local_40 + local_38;
    while (phVar1 = *pphVar3, phVar1 != (hashelement_t *)0x0) {
      if (threshold <= phVar1->count) {
        newelement = (heapelement_t *)calloc(1,0x28);
        if (newelement == (heapelement_t *)0x0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0x29d,"Heap install error. Out of memory!\n");
          exit(1);
        }
        pcVar2 = strdup(phVar1->basephone);
        newelement->basephone = pcVar2;
        pcVar2 = strdup(phVar1->leftcontext);
        newelement->leftcontext = pcVar2;
        pcVar2 = strdup(phVar1->rightcontext);
        newelement->rightcontext = pcVar2;
        pcVar2 = strdup(phVar1->wordposition);
        newelement->wordposition = pcVar2;
        heapsize = insert(&heap,heapsize,newelement);
      }
      pphVar3 = &phVar1->next;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

int32 make_CD_heap(hashelement_t  **triphonehash,
		   int32  threshold,
		   heapelement_t ***CDheap,
		   int32  *cdheapsize)
{
    heapelement_t **heap=NULL, *addtriphone;
    hashelement_t *triphone_el;
    int32 i, heapsize;

    heapsize = 0;
    for (i = 0; i < HASHSIZE; i++){
	triphone_el = triphonehash[i];
	while (triphone_el != NULL){
	    if (triphone_el->count >= threshold) {
		addtriphone = (heapelement_t *) calloc(1,sizeof(heapelement_t));
		if (addtriphone == NULL)
		    E_FATAL("Heap install error. Out of memory!\n");
		addtriphone->basephone = strdup(triphone_el->basephone);
		addtriphone->leftcontext = strdup(triphone_el->leftcontext);
		addtriphone->rightcontext = strdup(triphone_el->rightcontext);
	        addtriphone->wordposition = strdup(triphone_el->wordposition);
		heapsize = insert(&heap, heapsize, addtriphone);
            }
	    triphone_el = triphone_el->next;
        }
    }
    *CDheap = heap;
    *cdheapsize = heapsize;

    return S3_SUCCESS;
}